

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

void lua_concat(lua_State *L,int n)

{
  TValue *pTVar1;
  
  if (n < 2) {
    if (n == 0) {
      pTVar1 = L->top;
      (pTVar1->u32).lo = (L->glref).ptr32 + 0x80;
      (pTVar1->field_2).it = 0xfffffffb;
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar1 + 1) {
        lj_state_growstack(L,1);
        return;
      }
    }
  }
  else {
    do {
      pTVar1 = lj_meta_cat(L,L->top + -1,1 - n);
      if (pTVar1 == (TValue *)0x0) {
        L->top = L->top + -(ulong)(n - 1U);
        return;
      }
      n = (n - 1U) - (int)((ulong)((long)L->top - (long)pTVar1) >> 3);
      L->top = pTVar1 + 2;
      lj_vm_call(L,pTVar1,2);
      pTVar1 = L->top;
      L->top = pTVar1 + -1;
      pTVar1[-2] = pTVar1[-1];
    } while (1 < n);
  }
  return;
}

Assistant:

LUA_API void lua_concat(lua_State *L, int n)
{
  api_checknelems(L, n);
  if (n >= 2) {
    n--;
    do {
      TValue *top = lj_meta_cat(L, L->top-1, -n);
      if (top == NULL) {
	L->top -= n;
	break;
      }
      n -= (int)(L->top - top);
      L->top = top+2;
      lj_vm_call(L, top, 1+1);
      L->top--;
      copyTV(L, L->top-1, L->top);
    } while (--n > 0);
  } else if (n == 0) {  /* Push empty string. */
    setstrV(L, L->top, &G(L)->strempty);
    incr_top(L);
  }
  /* else n == 1: nothing to do. */
}